

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmudp.c
# Opt level: O0

int check_host(char *hostname,void *sin_addr)

{
  int iVar1;
  in_addr_t *in_RSI;
  char *in_RDI;
  in_addr addr;
  hostent *host_addr;
  in_addr local_24;
  hostent *local_20;
  in_addr_t *local_18;
  char *local_10;
  
  local_18 = in_RSI;
  local_10 = in_RDI;
  local_20 = gethostbyname(in_RDI);
  if (local_20 == (hostent *)0x0) {
    iVar1 = inet_aton(local_10,&local_24);
    if (iVar1 == 0) {
      return 0;
    }
    *local_18 = local_24.s_addr;
  }
  else {
    memcpy(local_18,*local_20->h_addr_list,(long)local_20->h_length);
  }
  return 1;
}

Assistant:

static int
check_host(char *hostname, void *sin_addr)
{
    struct hostent *host_addr;
    host_addr = gethostbyname(hostname);
    if (host_addr == NULL) {
	struct in_addr addr;
	if (inet_aton(hostname, &addr) == 0) {
	    /* 
	     *  not translatable as a hostname or 
	     * as a dot-style string IP address
	     */
	    return 0;
	}
	assert(sizeof(int) == sizeof(struct in_addr));
	*((int *) sin_addr) = *((int*) &addr);
    } else {
	memcpy(sin_addr, host_addr->h_addr, host_addr->h_length);
    }
    return 1;
}